

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typedisplay.cc
# Opt level: O2

bool __thiscall
Typelib::TypeDisplayVisitor::visit_(TypeDisplayVisitor *this,Compound *type,Field *field)

{
  ostream *poVar1;
  string local_40;
  
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  poVar1 = std::operator<<(poVar1,"(+");
  Field::getOffset(field);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,") ");
  TypeVisitor::visit_(&this->super_TypeVisitor,type,field);
  poVar1 = std::operator<<(this->m_stream," ");
  Field::getName_abi_cxx11_(&local_40,field);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

bool TypeDisplayVisitor::visit_(Compound const& type, Field const& field)
{
    m_stream << m_indent << "(+" << field.getOffset() << ") ";
    TypeVisitor::visit_(type, field);
    m_stream << " " << field.getName() << std::endl;
    return true;
}